

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_app.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  Exception *this;
  long lVar2;
  ulong uVar3;
  Scanner main_scanner;
  Virtual_Machine VM;
  Parser main_parser;
  
  if (1 < argc) {
    Scanner::Scanner(&main_scanner,argv[1]);
    Lex::construct_lex_map();
    Scanner::start(&main_scanner);
    if (DEBUG_MODE != 0) {
      Scanner::print_vec(&main_scanner);
      poVar1 = std::operator<<((ostream *)&std::cout,"--------TABLES--------");
      std::endl<char,std::char_traits<char>>(poVar1);
      lVar2 = 0;
      for (uVar3 = 0;
          uVar3 < (ulong)(((long)Scanner::ID_tables_vec.
                                 super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)Scanner::ID_tables_vec.
                                super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>._M_impl.
                                super__Vector_impl_data._M_start) / 0x18); uVar3 = uVar3 + 1) {
        ID_table_t::print_table
                  ((ID_table_t *)
                   ((long)&((Scanner::ID_tables_vec.
                             super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>._M_impl.
                             super__Vector_impl_data._M_start)->table).
                           super__Vector_base<ID,_std::allocator<ID>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar2));
        lVar2 = lVar2 + 0x18;
      }
      if (DEBUG_MODE != 0) {
        poVar1 = std::operator<<((ostream *)&std::cout,"$$$$$$$$$$ PARSER $$$$$$$$$$$");
        std::endl<char,std::char_traits<char>>(poVar1);
      }
    }
    Parser::Parser(&main_parser,&main_scanner.lex_vec,&Scanner::ID_tables_vec);
    Parser::start(&main_parser);
    if (DEBUG_MODE != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"--------TABLES--------");
      std::endl<char,std::char_traits<char>>(poVar1);
      lVar2 = 0;
      for (uVar3 = 0;
          uVar3 < (ulong)(((long)Scanner::ID_tables_vec.
                                 super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)Scanner::ID_tables_vec.
                                super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>._M_impl.
                                super__Vector_impl_data._M_start) / 0x18); uVar3 = uVar3 + 1) {
        ID_table_t::print_table
                  ((ID_table_t *)
                   ((long)&((Scanner::ID_tables_vec.
                             super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>._M_impl.
                             super__Vector_impl_data._M_start)->table).
                           super__Vector_base<ID,_std::allocator<ID>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar2));
        lVar2 = lVar2 + 0x18;
      }
      poVar1 = std::operator<<((ostream *)&std::cout,"$$$$$$$$$$ PROG $$$$$$$$$$$");
      std::endl<char,std::char_traits<char>>(poVar1);
      RPN::print(&main_parser.prog);
      if (DEBUG_MODE != 0) {
        poVar1 = std::operator<<((ostream *)&std::cout,"$$$$$$$$$$ VIRTUAL MACHINE $$$$$$$$$$$");
        std::endl<char,std::char_traits<char>>(poVar1);
      }
    }
    Virtual_Machine::Virtual_Machine(&VM,&main_parser.prog,main_parser.ID_tables_vec);
    Virtual_Machine::start(&VM);
    Virtual_Machine::~Virtual_Machine(&VM);
    Parser::~Parser(&main_parser);
    Scanner::~Scanner(&main_scanner);
    return 0;
  }
  this = (Exception *)__cxa_allocate_exception(0x30);
  Exception::Exception(this,"Interpreter error: no file",'\0');
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

int main(int argc, char* argv[]){
    try {
        if(argc < 2) throw Exception("Interpreter error: no file");

        int i;

        Scanner main_scanner(argv[1]);
        Lex::construct_lex_map();

        main_scanner.start();
        if (DEBUG_MODE){
            main_scanner.print_vec();
            cout << "--------TABLES--------" << endl;
            for (i = 0; i < main_scanner.ID_tables_vec.size(); ++i) {
                main_scanner.ID_tables_vec[i].print_table();
            }
        }
        if (DEBUG_MODE)
            cout << "$$$$$$$$$$ PARSER $$$$$$$$$$$" << endl;

        Parser main_parser(main_scanner.lex_vec, main_scanner.ID_tables_vec);
        main_parser.start();

        if (DEBUG_MODE) {
            cout << "--------TABLES--------" << endl;
            for (i = 0; i < main_scanner.ID_tables_vec.size(); ++i) {
                main_scanner.ID_tables_vec[i].print_table();
            }
            cout << "$$$$$$$$$$ PROG $$$$$$$$$$$" << endl;
            main_parser.prog.print();
        }

        if (DEBUG_MODE)
            cout << "$$$$$$$$$$ VIRTUAL MACHINE $$$$$$$$$$$" << endl;

        Virtual_Machine VM(main_parser.prog, main_parser.ID_tables_vec);
        VM.start();
    }
    catch (exception& ex){
        cout << ex.what() << endl;
        return -1;
    }
    return 0;
}